

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::Write
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,TPZStream *buf,int withclassid)

{
  long *plVar1;
  _List_node_base *p_Var2;
  int sz;
  int classid;
  ulong local_70;
  TPZVec<int> local_68;
  int aiStack_48 [5];
  undefined4 local_34;
  
  TPZInterpolatedElement::Write((TPZInterpolatedElement *)this,buf,withclassid);
  plVar1 = TPZVec<long>::begin(&(this->fConnectIndexes).super_TPZVec<long>);
  (*buf->_vptr_TPZStream[5])(buf,plVar1,0x15);
  TPZVec<int>::TPZVec(&local_68,0);
  local_68._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  local_68.fNElements = 3;
  local_68.fNAlloc = 0;
  aiStack_48[0] = 0;
  aiStack_48[1] = 0;
  aiStack_48[2] = 0;
  local_68.fStore = aiStack_48;
  TPZIntPrism3D::GetOrder(&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).fIntRule,&local_68);
  local_70 = local_68.fNElements;
  (*buf->_vptr_TPZStream[5])(buf,&local_70,1);
  if (local_70 != 0) {
    (*buf->_vptr_TPZStream[3])(buf,local_68.fStore,local_68.fNElements & 0xffffffff);
  }
  TPZStream::Write<int>(buf,&(this->fSideOrient).super_TPZVec<int>);
  plVar1 = TPZVec<long>::begin(&(this->fConnectIndexes).super_TPZVec<long>);
  (*buf->_vptr_TPZStream[5])(buf,plVar1,0x15);
  (*buf->_vptr_TPZStream[3])
            (buf,&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
                  super_TPZInterpolationSpace.fPreferredOrder,1);
  TPZStream::Write<int>(buf,&(this->fSideOrient).super_TPZVec<int>);
  local_70 = CONCAT44(local_70._4_4_,
                      (int)(this->fRestraints).
                           super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>
                           ._M_impl._M_node._M_size);
  (*buf->_vptr_TPZStream[3])(buf,&local_70,1);
  p_Var2 = (_List_node_base *)&this->fRestraints;
  while (p_Var2 = (((_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->fRestraints) {
    TPZOneShapeRestraint::Write((TPZOneShapeRestraint *)(p_Var2 + 1),buf);
  }
  local_34 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                    super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                    super_TPZCompEl + 0x20))(this);
  (*buf->_vptr_TPZStream[3])(buf,&local_34,1);
  if (local_68.fStore == aiStack_48) {
    local_68.fStore = (int *)0x0;
  }
  local_68.fNAlloc = 0;
  local_68._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_68.fStore != (int *)0x0) {
    operator_delete__(local_68.fStore);
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Write(TPZStream &buf, int withclassid) const
{
	TPZInterpolatedElement::Write(buf,withclassid);
  buf.Write(fConnectIndexes.begin(),TSHAPE::NSides);
	TPZManVector<int,3> order(3,0);
	this->fIntRule.GetOrder(order);
	buf.Write(order);
    buf.Write(fSideOrient);

	buf.Write(this->fConnectIndexes.begin(),TSHAPE::NSides);
	buf.Write(&this->fPreferredOrder,1);
    buf.Write(fSideOrient);
    int sz = fRestraints.size();
    buf.Write(&sz);
    for (std::list<TPZOneShapeRestraint>::const_iterator it = fRestraints.begin(); it != fRestraints.end(); it++) {
        it->Write(buf);
    }
	int classid = this->ClassId();
	buf.Write ( &classid, 1 );
}